

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeFunctionDefinitionArguments
               (ExpressionContext *ctx,IntrusiveList<SynFunctionArgument> arguments,
               TypeBase *parentType,TypeFunction *instance,SmallArray<ArgumentData,_8U> *argData)

{
  uint uniqueId;
  SynIdentifier *name;
  byte bVar1;
  int iVar2;
  ExprBase *initializer;
  ArgumentData *pAVar3;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  bool *failed_00;
  char *msg;
  SynFunctionArgument *pSVar5;
  SynBase *source;
  SynFunctionArgument *pSVar6;
  TypeHandle *pTVar7;
  SynFunctionArgument *source_00;
  uint index;
  bool failed;
  bool local_58;
  SynIdentifier *local_50;
  TypeBase *local_48;
  ExprBase *local_40;
  FunctionData *local_38;
  
  pSVar5 = arguments.head;
  if (instance == (TypeFunction *)0x0) {
    pTVar7 = (TypeHandle *)0x0;
  }
  else {
    pTVar7 = (instance->arguments).head;
  }
  pSVar6 = pSVar5;
  if (parentType == (TypeBase *)0x0) {
    bVar1 = 0;
  }
  else {
    bVar1 = parentType->isGeneric;
  }
  do {
    if (pSVar6 == (SynFunctionArgument *)0x0) {
      return;
    }
    if (pSVar6->initializer == (SynBase *)0x0) {
      initializer = (ExprBase *)0x0;
    }
    else {
      initializer = AnalyzeExpression(ctx,pSVar6->initializer);
    }
    if (instance == (TypeFunction *)0x0) {
      ExpressionContext::PushTemporaryScope(ctx);
      index = 0;
      source_00 = pSVar5;
      while ((source_00 != (SynFunctionArgument *)0x0 && (source_00 != pSVar6))) {
        pAVar3 = SmallArray<ArgumentData,_8U>::operator[](argData,index);
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        name = pAVar3->name;
        pTVar4 = pAVar3->type;
        uniqueId = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uniqueId + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var,iVar2),ctx->allocator,
                   &source_00->super_SynBase,ctx->scope,0,pTVar4,name,0,uniqueId);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var,iVar2),true);
        source_00 = (SynFunctionArgument *)(source_00->super_SynBase).next;
        if ((source_00 == (SynFunctionArgument *)0x0) || ((source_00->super_SynBase).typeID != 0x36)
           ) {
          source_00 = (SynFunctionArgument *)0x0;
        }
        index = index + 1;
      }
      _failed = (SynFunctionArgument *)((ulong)_failed & 0xffffffffffffff00);
      failed_00 = (bool *)0x0;
      if ((bVar1 & 1) != 0) {
        failed_00 = &failed;
      }
      pTVar4 = AnalyzeType(ctx,pSVar6->type,true,failed_00);
      if (pTVar4 == ctx->typeAuto) {
        if (initializer == (ExprBase *)0x0) {
          source = pSVar6->type;
          msg = "ERROR: function argument cannot be an auto type";
          goto LAB_0016f108;
        }
        initializer = ResolveInitializerValue(ctx,&pSVar6->super_SynBase,initializer);
        pTVar4 = initializer->type;
      }
      else if (initializer == (ExprBase *)0x0) {
        initializer = (ExprBase *)0x0;
      }
      else if ((((initializer->type == (TypeBase *)0x0) || (initializer->type->typeID != 0)) &&
               (pTVar4->isGeneric == false)) && (pTVar4->typeID != 0)) {
        CreateCast(ctx,pSVar6->type,initializer,pTVar4,true);
      }
      if (pTVar4 == ctx->typeVoid) {
        source = pSVar6->type;
        msg = "ERROR: function argument cannot be a void type";
LAB_0016f108:
        anon_unknown.dwarf_b837c::Stop(ctx,source,msg);
      }
      bVar1 = bVar1 | pTVar4->isGeneric;
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY);
    }
    else {
      pTVar4 = pTVar7->type;
      pTVar7 = pTVar7->next;
    }
    local_58 = (bool)(pSVar6->super_SynBase).field_0x3a;
    local_50 = pSVar6->name;
    local_38 = (FunctionData *)0x0;
    _failed = pSVar6;
    local_48 = pTVar4;
    local_40 = initializer;
    SmallArray<ArgumentData,_8U>::push_back(argData,(ArgumentData *)&failed);
    pSVar6 = (SynFunctionArgument *)(pSVar6->super_SynBase).next;
    if ((pSVar6 == (SynFunctionArgument *)0x0) || ((pSVar6->super_SynBase).typeID != 0x36)) {
      pSVar6 = (SynFunctionArgument *)0x0;
    }
  } while( true );
}

Assistant:

void AnalyzeFunctionDefinitionArguments(ExpressionContext &ctx, IntrusiveList<SynFunctionArgument> arguments, TypeBase *parentType, TypeFunction *instance, SmallArray<ArgumentData, 8> &argData)
{
	TypeHandle *instanceArg = instance ? instance->arguments.head : NULL;

	bool hadGenericArgument = parentType ? parentType->isGeneric : false;

	for(SynFunctionArgument *argument = arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next))
	{
		ExprBase *initializer = argument->initializer ? AnalyzeExpression(ctx, argument->initializer) : NULL;

		TypeBase *type = NULL;

		if(instance)
		{
			type = instanceArg->type;

			instanceArg = instanceArg->next;
		}
		else
		{
			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *prevArg = arguments.head; prevArg && prevArg != argument; prevArg = getType<SynFunctionArgument>(prevArg->next))
			{
				ArgumentData &data = argData[pos++];

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, prevArg, ctx.scope, 0, data.type, data.name, 0, ctx.uniqueVariableId++), true);
			}

			bool failed = false;
			type = AnalyzeType(ctx, argument->type, true, hadGenericArgument ? &failed : NULL);

			if(type == ctx.typeAuto)
			{
				if(!initializer)
					Stop(ctx, argument->type, "ERROR: function argument cannot be an auto type");

				initializer = ResolveInitializerValue(ctx, argument, initializer);

				type = initializer->type;
			}
			else if(initializer && !isType<TypeError>(initializer->type))
			{
				// Just a test
				if(!type->isGeneric && !isType<TypeError>(type))
					CreateCast(ctx, argument->type, initializer, type, true);
			}

			if(type == ctx.typeVoid)
				Stop(ctx, argument->type, "ERROR: function argument cannot be a void type");

			hadGenericArgument |= type->isGeneric;

			// Remove temporary scope
			ctx.PopScope(SCOPE_TEMPORARY);
		}

		argData.push_back(ArgumentData(argument, argument->isExplicit, argument->name, type, initializer));
	}
}